

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::mergefacets(tetgenmesh *this)

{
  shellface ppdVar1;
  shellface ppdVar2;
  shellface ppdVar3;
  point pc;
  memorypool *pmVar4;
  shellface ppdVar5;
  shellface ppdVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  tetgenmesh *this_00;
  shellface *pppdVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong *puVar14;
  tetgenmesh *ptVar15;
  tetgenmesh *ptVar16;
  ulong *puVar17;
  shellface *pppdVar18;
  int iVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double *pdVar26;
  double *pdVar27;
  shellface local_d0;
  face parentsh;
  double n2 [3];
  double n1 [3];
  
  parentsh.sh = (shellface *)0x0;
  parentsh.shver = 0;
  this_00 = (tetgenmesh *)operator_new(0x30);
  this_00->in = (tetgenio *)0x40000000008;
  this_00->addin = (tetgenio *)0x3ff0000000a;
  *(int *)&this_00->b = 0;
  this_00->subfaces = (memorypool *)0x0;
  local_d0 = (shellface)0x0;
  this_00->bgm = (tetgenmesh *)0x0;
  this_00->tetrahedrons = (memorypool *)0x0;
  dVar21 = cos((this->b->facet_separate_ang_tol / 180.0) * PI);
  ptVar15 = (tetgenmesh *)this->subsegs;
  memorypool::traversalinit((memorypool *)ptVar15);
  pppdVar9 = shellfacetraverse(ptVar15,this->subsegs);
  while (pppdVar9 != (shellface *)0x0) {
    lVar12 = (long)this->shmarkindex;
    if (*(int *)((long)pppdVar9 + lVar12 * 4) == -1) {
      uVar8 = (uint)*pppdVar9;
      parentsh.shver = uVar8 & 7;
      pppdVar18 = (shellface *)((ulong)*pppdVar9 & 0xfffffffffffffff8);
      parentsh.sh = pppdVar18;
      if (pppdVar18 != (shellface *)0x0) {
        uVar13 = (uint)parentsh.shver >> 1;
        ppdVar1 = pppdVar18[uVar13];
        uVar20 = (ulong)ppdVar1 & 0xfffffffffffffff8;
        if (uVar20 != 0) {
          ptVar15 = (tetgenmesh *)(ulong)((uint)((ulong)ppdVar1 >> 1) & 3);
          if (((shellface *)(*(ulong *)(uVar20 + (long)ptVar15 * 8) & 0xfffffffffffffff8) ==
               pppdVar18) &&
             (*(int *)((long)pppdVar18 + lVar12 * 4) == *(int *)(uVar20 + lVar12 * 4))) {
            ppdVar2 = pppdVar9[sorgpivot[0]];
            ppdVar3 = pppdVar9[sdestpivot[0]];
            pc = *(point *)(uVar20 + (long)sapexpivot[(uint)ppdVar1 & 7] * 8);
            facenormal(this,(point)ppdVar2,(point)ppdVar3,(point)pppdVar18[sapexpivot[uVar8 & 7]],n1
                       ,1,(double *)0x0);
            facenormal(this,(point)ppdVar2,(point)ppdVar3,pc,n2,1,(double *)0x0);
            auVar23._0_8_ = n1[0] * n1[0] + n1[1] * n1[1];
            auVar23._8_8_ = n2[0] * n2[0] + n2[1] * n2[1];
            auVar24._8_8_ = n2[2] * n2[2] + auVar23._8_8_;
            auVar24._0_8_ = n1[2] * n1[2] + auVar23._0_8_;
            auVar24 = sqrtpd(auVar23,auVar24);
            pdVar27 = (double *)
                      ((n1[2] * n2[2] + n1[0] * n2[0] + n1[1] * n2[1]) /
                      (auVar24._8_8_ * auVar24._0_8_));
            if (dVar21 <= (double)pdVar27) {
              ptVar15 = this_00;
              arraypool::newindex((arraypool *)this_00,&local_d0);
              *local_d0 = pdVar27;
              pppdVar9[6] = local_d0;
            }
            else {
              pppdVar18[(ulong)uVar13 + 6] = (shellface)0x0;
              *(undefined8 *)(uVar20 + 0x30 + (long)ptVar15 * 8) = 0;
              pmVar4 = this->subsegs;
              pppdVar9[3] = (shellface)0x0;
              *pppdVar9 = (shellface)pmVar4->deaditemstack;
              pmVar4->deaditemstack = pppdVar9;
              pmVar4->items = pmVar4->items + -1;
              ptVar15 = this;
              flipshpush(this,&parentsh);
            }
          }
        }
      }
    }
    pppdVar9 = shellfacetraverse(ptVar15,this->subsegs);
  }
  dVar21 = cos((this->b->facet_small_ang_tol / 180.0) * PI);
  dVar22 = cos(((this->b->facet_separate_ang_tol + -5.0) / 180.0) * PI);
  ptVar15 = (tetgenmesh *)this->subfaces;
  memorypool::traversalinit((memorypool *)ptVar15);
  ptVar16 = (tetgenmesh *)0x0;
  do {
    pppdVar9 = shellfacetraverse(ptVar15,this->subfaces);
    if (pppdVar9 == (shellface *)0x0) {
      arraypool::~arraypool((arraypool *)this_00);
      operator_delete(this_00,0x30);
      if (this->flipstack != (badface *)0x0) {
        lawsonflip(this);
      }
      return;
    }
    for (iVar11 = 0; ptVar15 = ptVar16, iVar11 != 3; iVar11 = iVar11 + 1) {
      iVar19 = (int)ptVar16;
      ppdVar1 = pppdVar9[(long)(iVar19 >> 1) + 6];
      uVar8 = snextpivot[iVar19];
      if ((ppdVar1 != (shellface)0x0) &&
         (ppdVar2 = pppdVar9[(long)((int)uVar8 >> 1) + 6], ppdVar2 != (shellface)0x0)) {
        ppdVar3 = pppdVar9[sorgpivot[iVar19]];
        ppdVar5 = pppdVar9[sdestpivot[iVar19]];
        ppdVar6 = pppdVar9[sapexpivot[iVar19]];
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          n1[lVar12] = (double)ppdVar3[lVar12] - (double)ppdVar5[lVar12];
        }
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          n2[lVar12] = (double)ppdVar6[lVar12] - (double)ppdVar5[lVar12];
        }
        auVar25._0_8_ = n1[0] * n1[0] + n1[1] * n1[1];
        auVar25._8_8_ = n2[0] * n2[0] + n2[1] * n2[1];
        auVar7._8_8_ = n2[2] * n2[2] + auVar25._8_8_;
        auVar7._0_8_ = n1[2] * n1[2] + auVar25._0_8_;
        auVar24 = sqrtpd(auVar25,auVar7);
        if (dVar21 < (n1[2] * n2[2] + n1[0] * n2[0] + n1[1] * n2[1]) /
                     (auVar24._8_8_ * auVar24._0_8_)) {
          puVar17 = (ulong *)((ulong)ppdVar1 & 0xfffffffffffffff8);
          ppdVar1 = (shellface)puVar17[6];
          pdVar26 = (double *)0x3ff0000000000000;
          pdVar27 = (double *)0x3ff0000000000000;
          if (ppdVar1 != (shellface)0x0) {
            pdVar27 = *ppdVar1;
            local_d0 = ppdVar1;
          }
          puVar14 = (ulong *)((ulong)ppdVar2 & 0xfffffffffffffff8);
          ppdVar1 = (shellface)puVar14[6];
          if (ppdVar1 != (shellface)0x0) {
            pdVar26 = *ppdVar1;
            local_d0 = ppdVar1;
          }
          if ((double)pdVar27 < dVar22) {
            if (dVar22 <= (double)pdVar26 || (double)pdVar27 < (double)pdVar26) {
              puVar14 = puVar17;
            }
          }
          else if (dVar22 <= (double)pdVar26) goto LAB_0012b72e;
          uVar8 = (uint)*puVar14;
          parentsh.shver = uVar8 & 7;
          parentsh.sh = (shellface *)(*puVar14 & 0xfffffffffffffff8);
          uVar10 = (ulong)(uVar8 & 6);
          uVar20 = *(ulong *)((long)parentsh.sh + uVar10 * 4);
          *(undefined8 *)((long)parentsh.sh + uVar10 * 4 + 0x30) = 0;
          *(undefined8 *)((uVar20 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)uVar20 & 6) * 4) = 0;
          pmVar4 = this->subsegs;
          puVar14[3] = 0;
          *puVar14 = (ulong)pmVar4->deaditemstack;
          pmVar4->deaditemstack = puVar14;
          pmVar4->items = pmVar4->items + -1;
          ptVar15 = this;
          flipshpush(this,&parentsh);
          break;
        }
      }
LAB_0012b72e:
      ptVar16 = (tetgenmesh *)(ulong)uVar8;
    }
  } while( true );
}

Assistant:

void tetgenmesh::mergefacets()
{
  face parentsh, neighsh, neineish;
  face segloop;
  point pa, pb, pc, pd;
  REAL n1[3], n2[3];
  REAL cosang, cosang_tol;


  // Allocate an array to save calcaulated dihedral angles at segments.
  arraypool *dihedangarray = new arraypool(sizeof(double), 10);
  REAL *paryang = NULL;

  // First, remove coplanar segments.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_separate_ang_tol / 180.0 * PI);

  subsegs->traversalinit();
  segloop.sh = shellfacetraverse(subsegs);
  while (segloop.sh != (shellface *) NULL) {
    // Only remove a segment if it has a marker '-1'.
    if (shellmark(segloop) != -1) {
      segloop.sh = shellfacetraverse(subsegs);
      continue;
    }
    spivot(segloop, parentsh);
    if (parentsh.sh != NULL) {
      spivot(parentsh, neighsh);
      if (neighsh.sh != NULL) {
        spivot(neighsh, neineish);
        if (neineish.sh == parentsh.sh) {
          // Exactly two subfaces at this segment.
          // Only merge them if they have the same boundary marker.
          if (shellmark(parentsh) == shellmark(neighsh)) {
            pa = sorg(segloop);
            pb = sdest(segloop);
            pc = sapex(parentsh);
            pd = sapex(neighsh);
            // Calculate the dihedral angle at the segment [a,b].
            facenormal(pa, pb, pc, n1, 1, NULL);
            facenormal(pa, pb, pd, n2, 1, NULL);
            cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
            if (cosang < cosang_tol) {
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
            } else {
              // Save 'cosang' to avoid re-calculate it.
              // Re-use the pointer at the first segment.
              dihedangarray->newindex((void **) &paryang);
              *paryang = cosang;
              segloop.sh[6] = (shellface) paryang;
            }
          } 
        } // if (neineish.sh == parentsh.sh)
      }
    }
    segloop.sh = shellfacetraverse(subsegs);
  }

  // Second, remove ridge segments at small angles.
  // The dihedral angle bound for two different facets.
  cosang_tol = cos(b->facet_small_ang_tol / 180.0 * PI);
  REAL cosang_sep_tol = cos((b->facet_separate_ang_tol - 5.0) / 180.0 * PI);
  face shloop;
  face seg1, seg2;
  REAL cosang1, cosang2;
  int i, j;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != (shellface *) NULL) {
    for (i = 0; i < 3; i++) {
      if (isshsubseg(shloop)) {
        senext(shloop, neighsh);
        if (isshsubseg(neighsh)) {
          // Found two segments sharing at one vertex.
          // Check if they form a small angle.
          pa = sorg(shloop);
          pb = sdest(shloop);
          pc = sapex(shloop);
          for (j = 0; j < 3; j++) n1[j] = pa[j] - pb[j];
          for (j = 0; j < 3; j++) n2[j] = pc[j] - pb[j];
          cosang = dot(n1, n2) / (sqrt(dot(n1, n1)) * sqrt(dot(n2, n2)));
          if (cosang > cosang_tol) {
            // Found a small angle.
            segloop.sh = NULL;
            sspivot(shloop, seg1);
            sspivot(neighsh, seg2);
            if (seg1.sh[6] != NULL) {
              paryang = (REAL *) (seg1.sh[6]);
              cosang1 = *paryang;
            } else {
              cosang1 = 1.0; // 0 degree;
            }
            if (seg2.sh[6] != NULL) {
              paryang = (REAL *) (seg2.sh[6]);
              cosang2 = *paryang;
            } else {
              cosang2 = 1.0; // 0 degree;
            }
            if (cosang1 < cosang_sep_tol) {
              if (cosang2 < cosang_sep_tol) {
                if (cosang1 < cosang2) {
                  segloop = seg1;
                } else {
                  segloop = seg2;
                }
              } else {
                segloop = seg1;
              }
            } else {
              if (cosang2 < cosang_sep_tol) {
                segloop = seg2;
              }
            }
            if (segloop.sh != NULL) {
              // Remove this segment.
              segloop.shver = 0;
              spivot(segloop, parentsh);
              spivot(parentsh, neighsh);
              ssdissolve(parentsh);
              ssdissolve(neighsh);
              shellfacedealloc(subsegs, segloop.sh);
              // Add the edge to flip stack.
              flipshpush(&parentsh);
              break;
            }
          }
        } // if (isshsubseg)
      } // if (isshsubseg)
      senextself(shloop);
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  delete dihedangarray;

  if (flipstack != NULL) {
    lawsonflip(); // Recover Delaunayness.
  }
}